

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::MaybeLogToStderr(LogSeverity severity,char *message,size_t len)

{
  char *pcVar1;
  size_t sStack_30;
  
  if ((severity < fLI::FLAGS_stderrthreshold) && (fLB::FLAGS_alsologtostderr != '\x01')) {
    return;
  }
  sStack_30 = len;
  if ((terminal_supports_color_ == '\x01') && (fLB::FLAGS_colorlogtostderr == '\x01')) {
    if (3 < (uint)severity) {
      __assert_fail("severity >= 0 && severity < NUM_SEVERITIES",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
                    ,0x117,"GLogColor google::SeverityToColor(LogSeverity)");
    }
    if (severity - 2U < 2) {
      pcVar1 = "1";
    }
    else {
      if (severity == 0) goto LAB_00113793;
      pcVar1 = "3";
    }
    fprintf(_stderr,"\x1b[0;3%sm",pcVar1);
    fwrite(message,len,1,_stderr);
    message = "\x1b[m";
    sStack_30 = 3;
  }
LAB_00113793:
  fwrite(message,sStack_30,1,_stderr);
  return;
}

Assistant:

inline void LogDestination::MaybeLogToStderr(LogSeverity severity,
					     const char* message, size_t len) {
  if ((severity >= FLAGS_stderrthreshold) || FLAGS_alsologtostderr) {
    ColoredWriteToStderr(severity, message, len);
#ifdef OS_WINDOWS
    // On Windows, also output to the debugger
    ::OutputDebugStringA(string(message,len).c_str());
#endif
  }
}